

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.cpp
# Opt level: O2

bool __thiscall OpenMD::Globals::addComponent(Globals *this,Component *comp)

{
  Component *local_8;
  
  local_8 = comp;
  std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>::push_back
            (&this->components_,&local_8);
  return true;
}

Assistant:

bool Globals::addComponent(Component* comp) {
    components_.push_back(comp);
    return true;
  }